

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O3

void Abc_SortMerge(int *p1Beg,int *p1End,int *p2Beg,int *p2End,int *pOut)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  
  uVar3 = (long)p2End - (long)p2Beg;
  uVar6 = (long)p1End - (long)p1Beg;
  piVar5 = pOut;
  piVar4 = pOut;
  if ((p1Beg <= p1End && uVar6 != 0) && (p2Beg <= p2End && uVar3 != 0)) {
    do {
      iVar1 = *p1Beg;
      iVar2 = *p2Beg;
      piVar5 = piVar4 + 1;
      if (iVar1 == iVar2) {
        p1Beg = p1Beg + 1;
        *piVar4 = iVar1;
        iVar1 = *p2Beg;
        p2Beg = p2Beg + 1;
        piVar4[1] = iVar1;
        piVar5 = piVar4 + 2;
      }
      else if (iVar1 < iVar2) {
        p1Beg = p1Beg + 1;
        *piVar4 = iVar1;
      }
      else {
        p2Beg = p2Beg + 1;
        *piVar4 = iVar2;
      }
    } while ((p1Beg < p1End) && (piVar4 = piVar5, p2Beg < p2End));
  }
  for (; p1Beg < p1End; p1Beg = p1Beg + 1) {
    *piVar5 = *p1Beg;
    piVar5 = piVar5 + 1;
  }
  for (; p2Beg < p2End; p2Beg = p2Beg + 1) {
    *piVar5 = *p2Beg;
    piVar5 = piVar5 + 1;
  }
  if ((long)piVar5 - (long)pOut >> 2 != (long)((int)(uVar3 >> 2) + (int)(uVar6 >> 2))) {
    __assert_fail("pOut - pOutBeg == nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilSort.c"
                  ,0x42,"void Abc_SortMerge(int *, int *, int *, int *, int *)");
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Merging two lists of entries.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_SortMerge( int * p1Beg, int * p1End, int * p2Beg, int * p2End, int * pOut )
{
    int nEntries = (p1End - p1Beg) + (p2End - p2Beg);
    int * pOutBeg = pOut;
    while ( p1Beg < p1End && p2Beg < p2End )
    {
        if ( *p1Beg == *p2Beg )
            *pOut++ = *p1Beg++, *pOut++ = *p2Beg++; 
        else if ( *p1Beg < *p2Beg )
            *pOut++ = *p1Beg++; 
        else // if ( *p1Beg > *p2Beg )
            *pOut++ = *p2Beg++; 
    }
    while ( p1Beg < p1End )
        *pOut++ = *p1Beg++; 
    while ( p2Beg < p2End )
        *pOut++ = *p2Beg++;
    assert( pOut - pOutBeg == nEntries );
}